

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void run_app(int argc,char **argv,SDL_Window *window)

{
  undefined4 uVar1;
  bool bVar2;
  int iVar3;
  Uint32 UVar4;
  ImGuiIO *pIVar5;
  stbi_uc *__first;
  ImGuiIO *pIVar6;
  ImDrawData *draw_data;
  byte bVar7;
  long lVar8;
  ImVec2 IVar9;
  allocator local_149;
  GLuint vao;
  GLuint colormap_texture;
  long local_140;
  vector<unsigned_char,_std::allocator<unsigned_char>_> colormap;
  int w;
  undefined4 uStack_11c;
  pointer local_118;
  SDL_Event event;
  Shader display_colormap;
  TransferFunctionWidget tfn_widget;
  
  pIVar5 = ImGui::GetIO();
  tfnw::TransferFunctionWidget::TransferFunctionWidget(&tfn_widget);
  local_140 = (long)argc;
  for (lVar8 = 1; lVar8 < local_140; lVar8 = lVar8 + 1) {
    __first = stbi_load(argv[lVar8],&w,(int *)&colormap_texture,(int *)&vao,4);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&colormap,__first,
               __first + (long)w * 4,(allocator_type *)&display_colormap);
    stbi_image_free(__first);
    std::__cxx11::string::string((string *)&event.common,argv[lVar8],&local_149);
    tfnw::Colormap::Colormap((Colormap *)&display_colormap,(string *)&event.common,&colormap,SRGB);
    tfnw::TransferFunctionWidget::add_colormap(&tfn_widget,(Colormap *)&display_colormap);
    tfnw::Colormap::~Colormap((Colormap *)&display_colormap);
    std::__cxx11::string::~string((string *)&event.common);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&colormap.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  }
  (*_ptrc_glGenTextures)(1,&colormap_texture);
  (*_ptrc_glBindTexture)(0xde0,colormap_texture);
  (*_ptrc_glTexParameteri)(0xde0,0x2801,0x2601);
  (*_ptrc_glTexParameteri)(0xde0,0x2800,0x2601);
  (*_ptrc_glTexParameteri)(0xde0,0x2802,0x812f);
  tfnw::TransferFunctionWidget::get_colormap(&colormap,&tfn_widget);
  (*_ptrc_glTexImage1D)
            (0xde0,0,0x8058,
             (GLsizei)((ulong)((long)colormap.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)colormap.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 2),0,0x1908,0x1401
             ,colormap.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start);
  (*_ptrc_glGenVertexArrays)(1,&vao);
  (*_ptrc_glBindVertexArray)(vao);
  (*_ptrc_glClearColor)(0.0,0.0,0.0,1.0);
  (*_ptrc_glDisable)(0xb71);
  (*_ptrc_glEnable)(0xbe2);
  (*_ptrc_glBlendFunc)(1,0x303);
  Shader::Shader(&display_colormap,&display_colormap_vs_abi_cxx11_,&display_colormap_fs_abi_cxx11_);
  do {
    bVar7 = 0;
    while( true ) {
      iVar3 = SDL_PollEvent(&event);
      if (iVar3 == 0) break;
      ImGui_ImplSDL2_ProcessEvent(&event);
      uVar1 = event.display.display;
      bVar7 = bVar7 | event.type == 0x100 |
              event.window.data2 == 0x1b & event.type == 0x300 & ~pIVar5->WantCaptureKeyboard;
      if (event.type == 0x200 && event.display.event == '\x0e') {
        UVar4 = SDL_GetWindowID(window);
        bVar7 = bVar7 | uVar1 == UVar4;
      }
      if ((event.type == 0x200) && (event.display.event == '\x05')) {
        win_width = event.display.data1;
        win_height = event.window.data2;
        IVar9.x = (float)event.display.data1;
        IVar9.y = (float)event.window.data2;
        pIVar5->DisplaySize = IVar9;
      }
    }
    bVar2 = tfnw::TransferFunctionWidget::changed(&tfn_widget);
    if (bVar2) {
      tfnw::TransferFunctionWidget::get_colormap
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&w,&tfn_widget);
      (*_ptrc_glTexImage1D)
                (0xde0,0,0x8058,
                 (GLsizei)((ulong)((long)local_118 - (long)CONCAT44(uStack_11c,w)) >> 2),0,0x1908,
                 0x1401,(void *)CONCAT44(uStack_11c,w));
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&w);
    }
    ImGui_ImplOpenGL3_NewFrame();
    ImGui_ImplSDL2_NewFrame();
    ImGui::NewFrame();
    ImGui::Begin("Debug Panel",(bool *)0x0,0);
    pIVar6 = ImGui::GetIO();
    local_140 = CONCAT44(local_140._4_4_,pIVar6->Framerate);
    pIVar6 = ImGui::GetIO();
    ImGui::Text("Application average %.3f ms/frame (%.1f FPS)",(double)(1000.0 / (float)local_140),
                SUB84((double)pIVar6->Framerate,0));
    tfnw::TransferFunctionWidget::draw_ui(&tfn_widget);
    ImGui::End();
    ImGui::Render();
    (*_ptrc_glViewport)(0,0,(int)(pIVar5->DisplaySize).x,(int)(pIVar5->DisplaySize).y);
    (*_ptrc_glClear)(0x4100);
    (*_ptrc_glUseProgram)(display_colormap.program);
    (*_ptrc_glDrawArrays)(5,0,4);
    draw_data = ImGui::GetDrawData();
    ImGui_ImplOpenGL3_RenderDrawData(draw_data);
    SDL_GL_SwapWindow(window);
  } while (bVar7 == 0);
  Shader::~Shader(&display_colormap);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&colormap.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  tfnw::TransferFunctionWidget::~TransferFunctionWidget(&tfn_widget);
  return;
}

Assistant:

void run_app(int argc, const char **argv, SDL_Window *window)
{
    ImGuiIO &io = ImGui::GetIO();

    tfnw::TransferFunctionWidget tfn_widget;

    // Load any extra colormaps the user wants to see in the demo
    for (int i = 1; i < argc; ++i) {
        int w, h, n;
        uint8_t *img_data = stbi_load(argv[i], &w, &h, &n, 4);
        auto img = std::vector<uint8_t>(img_data, img_data + w * 1 * 4);
        stbi_image_free(img_data);
        // Input images are assumed to be sRGB color-space
        tfn_widget.add_colormap(tfnw::Colormap(argv[i], img, tfnw::SRGB));
    }

    // A texture so we can color the background of the window by the colormap
    GLuint colormap_texture;
    glGenTextures(1, &colormap_texture);
    glBindTexture(GL_TEXTURE_1D, colormap_texture);
    glTexParameteri(GL_TEXTURE_1D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
    glTexParameteri(GL_TEXTURE_1D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
    glTexParameteri(GL_TEXTURE_1D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
    auto colormap = tfn_widget.get_colormap();
    glTexImage1D(GL_TEXTURE_1D,
                 0,
                 GL_RGBA8,
                 colormap.size() / 4,
                 0,
                 GL_RGBA,
                 GL_UNSIGNED_BYTE,
                 colormap.data());

    GLuint vao;
    glGenVertexArrays(1, &vao);
    glBindVertexArray(vao);

    glClearColor(0.0, 0.0, 0.0, 1.0);
    glDisable(GL_DEPTH_TEST);
    glEnable(GL_BLEND);
    glBlendFunc(GL_ONE, GL_ONE_MINUS_SRC_ALPHA);

    Shader display_colormap(display_colormap_vs, display_colormap_fs);

    bool done = false;
    while (!done) {
        SDL_Event event;
        while (SDL_PollEvent(&event)) {
            ImGui_ImplSDL2_ProcessEvent(&event);
            if (event.type == SDL_QUIT) {
                done = true;
            }
            if (!io.WantCaptureKeyboard && event.type == SDL_KEYDOWN &&
                event.key.keysym.sym == SDLK_ESCAPE) {
                done = true;
            }
            if (event.type == SDL_WINDOWEVENT && event.window.event == SDL_WINDOWEVENT_CLOSE &&
                event.window.windowID == SDL_GetWindowID(window)) {
                done = true;
            }
            if (event.type == SDL_WINDOWEVENT &&
                event.window.event == SDL_WINDOWEVENT_RESIZED) {
                win_width = event.window.data1;
                win_height = event.window.data2;
                io.DisplaySize.x = win_width;
                io.DisplaySize.y = win_height;
            }
        }

        if (tfn_widget.changed()) {
            auto colormap = tfn_widget.get_colormap();
            glTexImage1D(GL_TEXTURE_1D,
                         0,
                         GL_RGBA8,
                         colormap.size() / 4,
                         0,
                         GL_RGBA,
                         GL_UNSIGNED_BYTE,
                         colormap.data());
        }

        ImGui_ImplOpenGL3_NewFrame();
        ImGui_ImplSDL2_NewFrame(window);
        ImGui::NewFrame();

        ImGui::Begin("Debug Panel");
        ImGui::Text("Application average %.3f ms/frame (%.1f FPS)",
                    1000.0f / ImGui::GetIO().Framerate,
                    ImGui::GetIO().Framerate);
        tfn_widget.draw_ui();
        ImGui::End();

        // Rendering
        ImGui::Render();
        glViewport(0, 0, (int)io.DisplaySize.x, (int)io.DisplaySize.y);

        glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
        glUseProgram(display_colormap.program);
        glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);

        ImGui_ImplOpenGL3_RenderDrawData(ImGui::GetDrawData());

        SDL_GL_SwapWindow(window);
    }
}